

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O1

int run_test_tcp_create_early_bad_domain(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  uv_tcp_t client;
  undefined1 auStack_330 [128];
  uv_tcp_t uStack_2b0;
  uv_tcp_t uStack_1d8;
  uv_loop_t *puStack_100;
  long local_f0;
  long local_e8;
  uv_tcp_t local_e0;
  
  puStack_100 = (uv_loop_t *)0x1c83b7;
  puVar2 = uv_default_loop();
  puStack_100 = (uv_loop_t *)0x1c83c9;
  iVar1 = uv_tcp_init_ex(puVar2,&local_e0,0x2f);
  local_e8 = (long)iVar1;
  local_f0 = -0x16;
  if (local_e8 == -0x16) {
    puStack_100 = (uv_loop_t *)0x1c83ee;
    puVar2 = uv_default_loop();
    puStack_100 = (uv_loop_t *)0x1c8400;
    iVar1 = uv_tcp_init_ex(puVar2,&local_e0,0x400);
    local_e8 = (long)iVar1;
    local_f0 = -0x16;
    if (local_e8 != -0x16) goto LAB_001c8496;
    puStack_100 = (uv_loop_t *)0x1c8421;
    puVar2 = uv_default_loop();
    puStack_100 = (uv_loop_t *)0x1c842b;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puStack_100 = (uv_loop_t *)0x1c8430;
    unaff_RBX = uv_default_loop();
    puStack_100 = (uv_loop_t *)0x1c8444;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_100 = (uv_loop_t *)0x1c844e;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_e8 = 0;
    puStack_100 = (uv_loop_t *)0x1c845c;
    puVar2 = uv_default_loop();
    puStack_100 = (uv_loop_t *)0x1c8464;
    iVar1 = uv_loop_close(puVar2);
    local_f0 = (long)iVar1;
    if (local_e8 == local_f0) {
      puStack_100 = (uv_loop_t *)0x1c847c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_100 = (uv_loop_t *)0x1c8496;
    run_test_tcp_create_early_bad_domain_cold_1();
LAB_001c8496:
    puStack_100 = (uv_loop_t *)0x1c84a5;
    run_test_tcp_create_early_bad_domain_cold_2();
  }
  puStack_100 = (uv_loop_t *)run_test_tcp_create_early_accept;
  run_test_tcp_create_early_bad_domain_cold_3();
  puStack_100 = unaff_RBX;
  puVar2 = uv_default_loop();
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&uStack_2b0);
  uStack_1d8.data = (void *)(long)iVar1;
  auStack_330._24_8_ = (uv_close_cb)0x0;
  if (uStack_1d8.data == (void *)0x0) {
    iVar1 = uv_tcp_init(puVar2,&uStack_1d8);
    auStack_330._24_8_ = SEXT48(iVar1);
    auStack_330._0_8_ = (void *)0x0;
    if ((uv_close_cb)auStack_330._24_8_ != (uv_close_cb)0x0) goto LAB_001c86d2;
    iVar1 = uv_tcp_bind(&uStack_1d8,(sockaddr *)&uStack_2b0,0);
    auStack_330._24_8_ = SEXT48(iVar1);
    auStack_330._0_8_ = (void *)0x0;
    if ((uv_close_cb)auStack_330._24_8_ != (uv_close_cb)0x0) goto LAB_001c86e1;
    iVar1 = uv_listen((uv_stream_t *)&uStack_1d8,0x80,on_connection);
    auStack_330._24_8_ = SEXT48(iVar1);
    auStack_330._0_8_ = (void *)0x0;
    if ((uv_close_cb)auStack_330._24_8_ != (uv_close_cb)0x0) goto LAB_001c86f0;
    puVar2 = uv_default_loop();
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)auStack_330);
    uStack_2b0.data = (void *)(long)iVar1;
    auStack_330._24_8_ = (uv_close_cb)0x0;
    if (uStack_2b0.data != (void *)0x0) goto LAB_001c86ff;
    iVar1 = uv_tcp_init(puVar2,&uStack_2b0);
    auStack_330._24_8_ = SEXT48(iVar1);
    if ((uv_close_cb)auStack_330._24_8_ != (uv_close_cb)0x0) goto LAB_001c8711;
    iVar1 = uv_tcp_connect((uv_connect_t *)(auStack_330 + 0x18),&uStack_2b0,(sockaddr *)auStack_330,
                           on_connect);
    auStack_330._16_8_ = 0;
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_330._0_8_ = (void *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if ((void *)auStack_330._0_8_ == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c872f;
    }
  }
  else {
    run_test_tcp_create_early_accept_cold_1();
LAB_001c86d2:
    run_test_tcp_create_early_accept_cold_2();
LAB_001c86e1:
    run_test_tcp_create_early_accept_cold_3();
LAB_001c86f0:
    run_test_tcp_create_early_accept_cold_4();
LAB_001c86ff:
    run_test_tcp_create_early_accept_cold_5();
LAB_001c8711:
    run_test_tcp_create_early_accept_cold_6();
  }
  run_test_tcp_create_early_accept_cold_7();
LAB_001c872f:
  handle = (uv_handle_t *)auStack_330;
  run_test_tcp_create_early_accept_cold_8();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_create_early_bad_domain) {
  uv_tcp_t client;
  int r;

  r = uv_tcp_init_ex(uv_default_loop(), &client, 47);
  ASSERT_EQ(r, UV_EINVAL);

  r = uv_tcp_init_ex(uv_default_loop(), &client, 1024);
  ASSERT_EQ(r, UV_EINVAL);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}